

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O2

int __thiscall
highs::RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree>::unlink
          (RbTree<HighsDomain::ObjectivePropagation::ObjectiveContributionTree> *this,char *__name)

{
  int iVar1;
  int v;
  LinkType LVar2;
  LinkType u;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  LinkType nilParent;
  long local_38;
  
  nilParent = -1;
  iVar5 = (int)__name;
  if (iVar5 == -1) {
    lVar3 = *(long *)this[2].rootNode;
    bVar8 = true;
    lVar6 = -1;
  }
  else {
    lVar6 = (long)iVar5;
    lVar3 = *(long *)this[2].rootNode;
    bVar8 = -1 < *(int *)(lVar3 + 0x18 + lVar6 * 0x20);
  }
  lVar6 = lVar6 * 0x20;
  iVar1 = *(int *)(lVar3 + 0x10 + lVar6);
  v = *(int *)(lVar3 + 0x14 + lVar6);
  if (iVar1 == -1) {
    transplant(this,iVar5,v,&nilParent);
    iVar5 = extraout_EAX;
    goto joined_r0x002aa76b;
  }
  if (v == -1) {
    transplant(this,iVar5,iVar1,&nilParent);
    v = iVar1;
    iVar5 = extraout_EAX_00;
    goto joined_r0x002aa76b;
  }
  u = first(this,v);
  lVar3 = *(long *)this[2].rootNode;
  if (u == -1) {
    lVar7 = -1;
    uVar4 = *(uint *)(lVar3 + -8);
    bVar8 = true;
  }
  else {
    lVar7 = (long)u;
    uVar4 = *(uint *)(lVar3 + 0x18 + lVar7 * 0x20);
    bVar8 = -1 < (int)uVar4;
  }
  lVar7 = lVar7 * 0x20;
  v = *(int *)(lVar3 + 0x14 + lVar7);
  local_38 = lVar7;
  if ((uVar4 & 0x7fffffff) - 1 == iVar5) {
    iVar1 = v;
    LVar2 = u;
    if (v != -1) goto LAB_002aa7e4;
  }
  else {
    transplant(this,u,v,&nilParent);
    lVar3 = *(long *)this[2].rootNode;
    iVar1 = *(int *)(lVar3 + 0x14 + lVar6);
    *(int *)(lVar3 + 0x14 + lVar7) = iVar1;
LAB_002aa7e4:
    *(uint *)(lVar3 + 0x18 + (long)iVar1 * 0x20) =
         *(uint *)(lVar3 + 0x18 + (long)iVar1 * 0x20) & 0x80000000 | u + 1U;
    LVar2 = nilParent;
  }
  nilParent = LVar2;
  transplant(this,iVar5,u,&nilParent);
  lVar3 = *(long *)this[2].rootNode;
  iVar5 = *(int *)(lVar3 + 0x10 + lVar6);
  *(int *)(lVar3 + 0x10 + local_38) = iVar5;
  lVar7 = (long)iVar5 * 0x20;
  *(uint *)(lVar3 + 0x18 + lVar7) = *(uint *)(lVar3 + 0x18 + lVar7) & 0x80000000 | u + 1U;
  setColor(this,u,*(uint *)(lVar3 + 0x18 + lVar6) >> 0x1f);
  iVar5 = extraout_EAX_02;
joined_r0x002aa76b:
  if (bVar8) {
    deleteFixup(this,v,nilParent);
    iVar5 = extraout_EAX_01;
  }
  return iVar5;
}

Assistant:

void unlink(LinkType z) {
    LinkType nilParent = kNoLink;
    LinkType y = z;
    bool yWasBlack = isBlack(y);
    LinkType x;

    if (getChild(z, kLeft) == kNoLink) {
      x = getChild(z, kRight);
      transplant(z, x, nilParent);
    } else if (getChild(z, kRight) == kNoLink) {
      x = getChild(z, kLeft);
      transplant(z, x, nilParent);
    } else {
      y = first(getChild(z, kRight));
      yWasBlack = isBlack(y);
      x = getChild(y, kRight);
      if (getParent(y) == z) {
        if (x == kNoLink)
          nilParent = y;
        else
          setParent(x, y);
      } else {
        transplant(y, getChild(y, kRight), nilParent);
        LinkType zRight = getChild(z, kRight);
        setChild(y, kRight, zRight);
        setParent(zRight, y);
      }
      transplant(z, y, nilParent);
      LinkType zLeft = getChild(z, kLeft);
      setChild(y, kLeft, zLeft);
      setParent(zLeft, y);
      setColor(y, getColor(z));
    }

    if (yWasBlack) deleteFixup(x, nilParent);
  }